

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int anon_unknown.dwarf_3c4::ToolTargetsSourceList(State *state)

{
  bool bVar1;
  reference ppEVar2;
  reference ppNVar3;
  Edge *pEVar4;
  undefined8 uVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_30;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_28;
  iterator inps;
  __normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> local_18;
  iterator e;
  State *state_local;
  
  e._M_current = (Edge **)state;
  local_18._M_current = (Edge **)std::vector<Edge_*,_std::allocator<Edge_*>_>::begin(&state->edges_)
  ;
  while( true ) {
    inps._M_current =
         (Node **)std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)(e._M_current + 0xd));
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_> *)
                       &inps);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::
              operator*(&local_18);
    local_28._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&(*ppEVar2)->inputs_);
    while( true ) {
      ppEVar2 = __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>
                ::operator*(&local_18);
      local_30._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&(*ppEVar2)->inputs_);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_28);
      pEVar4 = Node::in_edge(*ppNVar3);
      if (pEVar4 == (Edge *)0x0) {
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_28);
        Node::path_abi_cxx11_(*ppNVar3);
        uVar5 = std::__cxx11::string::c_str();
        printf("%s\n",uVar5);
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_28);
    }
    __gnu_cxx::__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>::operator++
              (&local_18);
  }
  return 0;
}

Assistant:

int ToolTargetsSourceList(State* state) {
  for (vector<Edge*>::iterator e = state->edges_.begin();
       e != state->edges_.end(); ++e) {
    for (vector<Node*>::iterator inps = (*e)->inputs_.begin();
         inps != (*e)->inputs_.end(); ++inps) {
      if (!(*inps)->in_edge())
        printf("%s\n", (*inps)->path().c_str());
    }
  }
  return 0;
}